

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O2

TProb<double> *
libDAI::min<double>(TProb<double> *__return_storage_ptr__,TProb<double> *a,TProb<double> *b)

{
  undefined1 auVar1 [16];
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  undefined1 auVar7 [16];
  
  TProb<double>::TProb
            (__return_storage_ptr__,
             (long)(a->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(a->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  pdVar2 = (a->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (a->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (b->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar6 = 0; (long)pdVar3 - (long)pdVar2 >> 3 != lVar6; lVar6 = lVar6 + 1) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = pdVar2[lVar6];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pdVar4[lVar6];
    auVar1 = vminsd_avx(auVar7,auVar1);
    pdVar5[lVar6] = auVar1._0_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

TProb<T> min( const TProb<T> &a, const TProb<T> &b ) {
        assert( a.size() == b.size() );
        TProb<T> result( a.size() );
        for( size_t i = 0; i < a.size(); i++ )
            if( a[i] < b[i] )
                result[i] = a[i];
            else
                result[i] = b[i];
        return result;
    }